

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall
QWizard::setDefaultProperty(QWizard *this,char *className,char *property,char *changedSignal)

{
  int iVar1;
  QWizardPrivate *pQVar2;
  qsizetype qVar3;
  char *pcVar4;
  char *in_RSI;
  long in_FS_OFFSET;
  int i;
  QWizardPrivate *d;
  rvalue_ref in_stack_ffffffffffffff68;
  QList<QWizardDefaultProperty> *in_stack_ffffffffffffff70;
  QWizardDefaultProperty *this_00;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  char local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QWizard *)0x7bc02a);
  qVar3 = QList<QWizardDefaultProperty>::size(&pQVar2->defaultPropertyTable);
  iVar5 = (int)qVar3;
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 < 0) goto LAB_007bc0ab;
    QList<QWizardDefaultProperty>::at
              (in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x7bc06d);
    iVar1 = qstrcmp(pcVar4,in_RSI);
  } while (iVar1 != 0);
  QList<QWizardDefaultProperty>::remove(&pQVar2->defaultPropertyTable,(char *)(long)iVar5);
LAB_007bc0ab:
  this_00 = (QWizardDefaultProperty *)&pQVar2->defaultPropertyTable;
  QWizardDefaultProperty::QWizardDefaultProperty
            ((QWizardDefaultProperty *)CONCAT44(iVar5,in_stack_ffffffffffffff80),local_50,
             (char *)this_00,(char *)in_stack_ffffffffffffff68);
  QList<QWizardDefaultProperty>::append
            ((QList<QWizardDefaultProperty> *)this_00,in_stack_ffffffffffffff68);
  QWizardDefaultProperty::~QWizardDefaultProperty(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setDefaultProperty(const char *className, const char *property,
                                 const char *changedSignal)
{
    Q_D(QWizard);
    for (int i = d->defaultPropertyTable.size() - 1; i >= 0; --i) {
        if (qstrcmp(d->defaultPropertyTable.at(i).className, className) == 0) {
            d->defaultPropertyTable.remove(i);
            break;
        }
    }
    d->defaultPropertyTable.append(QWizardDefaultProperty(className, property, changedSignal));
}